

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O1

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  pointer pcVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var5;
  bool bVar6;
  int iVar7;
  BadNameString *pBVar8;
  pointer pbVar9;
  long lVar10;
  bool bVar11;
  string name;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  value_type local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  int local_138;
  undefined4 uStack_134;
  long local_130;
  undefined1 local_128 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  pbVar9 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (input->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
              *)__return_storage_ptr__;
  if (pbVar9 != local_d8) {
    do {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      pcVar1 = (pbVar9->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar1,pcVar1 + pbVar9->_M_string_length);
      sVar3 = local_178._M_string_length;
      if (local_178._M_string_length != 0) {
        if (((local_178._M_string_length == 1) || (*local_178._M_dataplus._M_p != '-')) ||
           (local_178._M_dataplus._M_p[1] == '-')) {
          if (local_178._M_string_length < 3) {
            bVar11 = false;
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_178);
            iVar7 = ::std::__cxx11::string::compare((char *)local_50);
            bVar11 = iVar7 == 0;
          }
          if ((2 < sVar3) && (local_50[0] != local_40)) {
            operator_delete(local_50[0]);
          }
          if (bVar11) {
            ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_178);
            ::std::__cxx11::string::operator=((string *)&local_178,(string *)&local_138);
            if ((undefined1 *)CONCAT44(uStack_134,local_138) != local_128) {
              operator_delete((undefined1 *)CONCAT44(uStack_134,local_138));
            }
            if (local_178._M_string_length == 0) {
LAB_0011df80:
              pBVar8 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::BadLongName(pBVar8,&local_90);
              __cxa_throw(pBVar8,&BadNameString::typeinfo,Error::~Error);
            }
            bVar11 = valid_first_char<char>(*local_178._M_dataplus._M_p);
            if (!bVar11) goto LAB_0011df80;
            ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_178);
            lVar4 = local_130;
            bVar11 = local_130 == 0;
            if (!bVar11) {
              lVar2 = CONCAT44(uStack_134,local_138);
              lVar10 = 0;
              do {
                bVar6 = valid_later_char<char>(*(char *)(lVar2 + lVar10));
                if (!bVar6) break;
                lVar10 = lVar10 + 1;
                bVar11 = lVar4 == lVar10;
              } while (!bVar11);
            }
            if ((undefined1 *)CONCAT44(uStack_134,local_138) != local_128) {
              operator_delete((undefined1 *)CONCAT44(uStack_134,local_138));
            }
            if (!bVar11) goto LAB_0011df80;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_118,&local_178);
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)&local_178);
            if (iVar7 == 0) {
LAB_0011dfe3:
              pBVar8 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::DashesOnly(pBVar8,&local_b0);
              __cxa_throw(pBVar8,&BadNameString::typeinfo,Error::~Error);
            }
            iVar7 = ::std::__cxx11::string::compare((char *)&local_178);
            if (iVar7 == 0) goto LAB_0011dfe3;
            if (local_158._M_string_length != 0) {
              pBVar8 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::MultiPositionalNames(pBVar8,&local_d0);
              __cxa_throw(pBVar8,&BadNameString::typeinfo,Error::~Error);
            }
            ::std::__cxx11::string::_M_assign((string *)&local_158);
          }
        }
        else {
          if (local_178._M_string_length != 2) {
LAB_0011e0a6:
            pBVar8 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_178._M_dataplus._M_p,
                       local_178._M_dataplus._M_p + local_178._M_string_length);
            BadNameString::OneCharName(pBVar8,&local_70);
            __cxa_throw(pBVar8,&BadNameString::typeinfo,Error::~Error);
          }
          bVar11 = valid_first_char<char>(local_178._M_dataplus._M_p[1]);
          if (!bVar11) goto LAB_0011e0a6;
          local_138 = 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     &local_138,local_178._M_dataplus._M_p + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_d8);
  }
  p_Var5 = local_e0;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_e0,&local_f8,&local_118,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var5;
}

Assistant:

inline std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;

    for(std::string name : input) {
        if(name.length() == 0)
            continue;
        else if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--") {
            throw BadNameString::DashesOnly(name);
        } else {
            if(pos_name.length() > 0)
                throw BadNameString::MultiPositionalNames(name);
            pos_name = name;
        }
    }

    return std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>(
        short_names, long_names, pos_name);
}